

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O2

bool __thiscall ProjectGenerator::openOutput(ProjectGenerator *this,QFile *file,QString *build)

{
  long lVar1;
  QString file_00;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 local_b8 [8];
  QArrayDataPointer<char16_t> local_b0;
  ProString local_98;
  ProString fileName;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fileName.m_file = -0x55555556;
  fileName._36_4_ = 0xaaaaaaaa;
  fileName.m_hash._0_4_ = 0xaaaaaaaa;
  fileName.m_hash._4_4_ = 0xaaaaaaaa;
  fileName.m_string.d.size._0_4_ = 0xaaaaaaaa;
  fileName.m_string.d.size._4_4_ = 0xaaaaaaaa;
  fileName.m_offset = -0x55555556;
  fileName.m_length = -0x55555556;
  fileName.m_string.d.d._0_4_ = 0xaaaaaaaa;
  fileName.m_string.d.d._4_4_ = 0xaaaaaaaa;
  fileName.m_string.d.ptr._0_4_ = 0xaaaaaaaa;
  fileName.m_string.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)file + 0xe8))(&local_98);
  ProString::ProString(&fileName,&local_98.m_string);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  bVar4 = ProString::endsWith(&fileName,&Option::pro_ext,CaseSensitive);
  pcVar3 = Option::output_dir.d.ptr;
  pDVar2 = Option::output_dir.d.d;
  if (!bVar4) {
    if (fileName.m_length == 0) {
      if (Option::output_dir.d.d != (Data *)0x0) {
        LOCK();
        ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      file_00.d.ptr = (char16_t *)pDVar2;
      file_00.d.d = (Data *)in_stack_ffffffffffffff28;
      file_00.d.size = (qsizetype)pcVar3;
      MakefileGenerator::fileInfo((MakefileGenerator *)local_b8,file_00);
      QFileInfo::fileName();
      ProString::ProString(&local_98,(QString *)(local_b8 + 8));
      ProString::operator=(&fileName,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_b8 + 8))
      ;
      QFileInfo::~QFileInfo((QFileInfo *)local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff30);
    }
    local_b0.ptr = (char16_t *)&Option::pro_ext;
    local_b0.d = (Data *)&fileName;
    QStringBuilder<ProString_&,_QString_&>::convertTo<QString>
              (&local_98.m_string,(QStringBuilder<ProString_&,_QString_&> *)(local_b8 + 8));
    QFile::setFileName((QString *)file);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  bVar4 = MakefileGenerator::openOutput(&this->super_MakefileGenerator,file,build);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fileName);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool
ProjectGenerator::openOutput(QFile &file, const QString &build) const
{
    ProString fileName = file.fileName();
    if (!fileName.endsWith(Option::pro_ext)) {
        if (fileName.isEmpty())
            fileName = fileInfo(Option::output_dir).fileName();
        file.setFileName(fileName + Option::pro_ext);
    }
    return MakefileGenerator::openOutput(file, build);
}